

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddUtilityCommand
          (cmMakefile *this,string *utilityName,TargetOrigin origin,bool excludeFromAll,
          char *workingDirectory,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,bool escapeOldStyle,char *comment,
          bool uses_terminal,bool command_expand_lists,string *job_pool)

{
  pointer pbVar1;
  bool bVar2;
  string *psVar3;
  cmSourceFile *pcVar4;
  undefined7 in_register_00000009;
  string *byproduct;
  pointer sourceName;
  char *comment_00;
  allocator<char> local_b9;
  cmMakefile *local_b8;
  cmTarget *local_b0;
  string force;
  string local_88;
  string no_main_dependency;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forced;
  
  local_b8 = this;
  local_b0 = AddNewTarget(this,UTILITY,utilityName);
  cmTarget::SetIsGeneratorProvided(local_b0,origin == Generator);
  if ((int)CONCAT71(in_register_00000009,excludeFromAll) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&force,"EXCLUDE_FROM_ALL",(allocator<char> *)&no_main_dependency);
    bVar2 = GetPropertyAsBool(local_b8,&force);
    std::__cxx11::string::~string((string *)&force);
    if (!bVar2) goto LAB_001693ff;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&force,"EXCLUDE_FROM_ALL",(allocator<char> *)&no_main_dependency);
  cmTarget::SetProperty(local_b0,&force,"TRUE");
  std::__cxx11::string::~string((string *)&force);
LAB_001693ff:
  comment_00 = "";
  if (comment != (char *)0x0) {
    comment_00 = comment;
  }
  if (((commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((depends->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (depends->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    psVar3 = GetCurrentBinaryDirectory_abi_cxx11_(local_b8);
    std::__cxx11::string::string((string *)&force,(string *)psVar3);
    std::__cxx11::string::append((char *)&force);
    std::__cxx11::string::append((char *)&force);
    std::__cxx11::string::append((string *)&force);
    forced.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    forced.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    forced.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&forced,&force);
    no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
    no_main_dependency._M_string_length = 0;
    no_main_dependency.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_b9);
    AddCustomCommandToOutput
              (local_b8,&forced,byproducts,depends,&no_main_dependency,commandLines,comment_00,
               workingDirectory,false,escapeOldStyle,uses_terminal,command_expand_lists,&local_88,
               job_pool);
    std::__cxx11::string::~string((string *)&local_88);
    pcVar4 = cmTarget::AddSourceCMP0049(local_b0,&force);
    if (pcVar4 == (cmSourceFile *)0x0) {
      std::operator+(&local_88,"Could not get source file entry for ",&force);
      cmSystemTools::Error(&local_88);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"SYMBOLIC",&local_b9);
      cmSourceFile::SetProperty(pcVar4,&local_88,"1");
    }
    std::__cxx11::string::~string((string *)&local_88);
    pbVar1 = (byproducts->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (sourceName = (byproducts->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; sourceName != pbVar1;
        sourceName = sourceName + 1) {
      pcVar4 = GetOrCreateSource(local_b8,sourceName,true,Known);
      if (pcVar4 != (cmSourceFile *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"GENERATED",&local_b9);
        cmSourceFile::SetProperty(pcVar4,&local_88,"1");
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&forced);
    std::__cxx11::string::~string((string *)&force);
  }
  return local_b0;
}

Assistant:

cmTarget* cmMakefile::AddUtilityCommand(
  const std::string& utilityName, TargetOrigin origin, bool excludeFromAll,
  const char* workingDirectory, const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends,
  const cmCustomCommandLines& commandLines, bool escapeOldStyle,
  const char* comment, bool uses_terminal, bool command_expand_lists,
  const std::string& job_pool)
{
  // Create a target instance for this utility.
  cmTarget* target = this->AddNewTarget(cmStateEnums::UTILITY, utilityName);
  target->SetIsGeneratorProvided(origin == TargetOrigin::Generator);
  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  if (!comment) {
    // Use an empty comment to avoid generation of default comment.
    comment = "";
  }

  // Store the custom command in the target.
  if (!commandLines.empty() || !depends.empty()) {
    std::string force = this->GetCurrentBinaryDirectory();
    force += "/CMakeFiles";
    force += "/";
    force += utilityName;
    std::vector<std::string> forced;
    forced.push_back(force);
    std::string no_main_dependency;
    bool no_replace = false;
    this->AddCustomCommandToOutput(
      forced, byproducts, depends, no_main_dependency, commandLines, comment,
      workingDirectory, no_replace, escapeOldStyle, uses_terminal,
      command_expand_lists, /*depfile=*/"", job_pool);
    cmSourceFile* sf = target->AddSourceCMP0049(force);

    // The output is not actually created so mark it symbolic.
    if (sf) {
      sf->SetProperty("SYMBOLIC", "1");
    } else {
      cmSystemTools::Error("Could not get source file entry for " + force);
    }

    // Always create the byproduct sources and mark them generated.
    for (std::string const& byproduct : byproducts) {
      if (cmSourceFile* out = this->GetOrCreateSource(
            byproduct, true, cmSourceFileLocationKind::Known)) {
        out->SetProperty("GENERATED", "1");
      }
    }
  }
  return target;
}